

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O0

TypeAndOffset * __thiscall
soul::SubElementPath::getElement
          (TypeAndOffset *__return_storage_ptr__,SubElementPath *this,Type *parentType)

{
  ulong uVar1;
  bool bVar2;
  Structure *this_00;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *this_01;
  size_t sVar3;
  Member *pMVar4;
  uint64_t uVar5;
  ulong local_80;
  size_t i;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *members;
  unsigned_long *local_48;
  unsigned_long *index;
  unsigned_long *__end1;
  unsigned_long *__begin1;
  ArrayWithPreallocation<unsigned_long,_4UL> *__range1;
  Type *local_20;
  Type *parentType_local;
  SubElementPath *this_local;
  TypeAndOffset *e;
  
  __range1._7_1_ = 0;
  local_20 = parentType;
  parentType_local = (Type *)this;
  this_local = (SubElementPath *)__return_storage_ptr__;
  Type::Type(&__return_storage_ptr__->type,parentType);
  __return_storage_ptr__->offset = 0;
  __begin1 = (unsigned_long *)this;
  __end1 = ArrayWithPreallocation<unsigned_long,_4UL>::begin(&this->indexes);
  index = ArrayWithPreallocation<unsigned_long,_4UL>::end
                    ((ArrayWithPreallocation<unsigned_long,_4UL> *)__begin1);
  do {
    if (__end1 == index) {
      return __return_storage_ptr__;
    }
    local_48 = __end1;
    bVar2 = Type::isArrayOrVector(&__return_storage_ptr__->type);
    if (bVar2) {
      bVar2 = Type::isUnsizedArray(&__return_storage_ptr__->type);
      checkAssertion(!bVar2,"! e.type.isUnsizedArray()","getElement",0x22e);
      bVar2 = Type::isValidArrayOrVectorIndex<unsigned_long>
                        (&__return_storage_ptr__->type,*local_48);
      checkAssertion(bVar2,"e.type.isValidArrayOrVectorIndex (index)","getElement",0x22f);
      Type::getElementType((Type *)&members,&__return_storage_ptr__->type);
      Type::operator=(&__return_storage_ptr__->type,(Type *)&members);
      Type::~Type((Type *)&members);
      uVar5 = Type::getPackedSizeInBytes(&__return_storage_ptr__->type);
      __return_storage_ptr__->offset = uVar5 * *local_48 + __return_storage_ptr__->offset;
    }
    else {
      bVar2 = Type::isStruct(&__return_storage_ptr__->type);
      if (!bVar2) {
        throwInternalCompilerError("getElement",0x242);
      }
      this_00 = Type::getStructRef(&__return_storage_ptr__->type);
      this_01 = Structure::getMembers(this_00);
      uVar1 = *local_48;
      sVar3 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::size(this_01);
      checkAssertion(uVar1 < sVar3,"index < members.size()","getElement",0x239);
      pMVar4 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[](this_01,*local_48);
      Type::operator=(&__return_storage_ptr__->type,&pMVar4->type);
      for (local_80 = 0; local_80 < *local_48; local_80 = local_80 + 1) {
        pMVar4 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[](this_01,local_80);
        uVar5 = Type::getPackedSizeInBytes(&pMVar4->type);
        __return_storage_ptr__->offset = uVar5 + __return_storage_ptr__->offset;
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

SubElementPath::TypeAndOffset SubElementPath::getElement (const Type& parentType) const
{
    TypeAndOffset e { parentType, 0 };

    for (auto& index : indexes)
    {
        if (e.type.isArrayOrVector())
        {
            SOUL_ASSERT (! e.type.isUnsizedArray());
            SOUL_ASSERT (e.type.isValidArrayOrVectorIndex (index));

            e.type = e.type.getElementType();
            e.offset += ((size_t) e.type.getPackedSizeInBytes()) * index;
            continue;
        }

        if (e.type.isStruct())
        {
            auto& members = e.type.getStructRef().getMembers();
            SOUL_ASSERT (index < members.size());
            e.type = members[index].type;

            for (size_t i = 0; i < index; ++i)
                e.offset += (size_t) members[i].type.getPackedSizeInBytes();

            continue;
        }

        SOUL_ASSERT_FALSE;
    }

    return e;
}